

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::ScanLineInputFile::Data::readPixels(Data *this,FrameBuffer *fb,int scanLine1,int scanLine2)

{
  mutex *__mutex;
  exr_chunk_info_t *peVar1;
  _func_exr_result_t__exr_decode_pipeline_ptr *p_Var2;
  ScanLineProcess *this_00;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*> aVar5;
  int iVar6;
  exr_result_t eVar7;
  void *pvVar8;
  Task *this_01;
  __base_type _Var9;
  ScanLineProcess *this_02;
  InputExc *this_03;
  char *pcVar10;
  ostream *poVar11;
  ArgExc *pAVar12;
  IoExc *pIVar13;
  code *pcVar14;
  ulong uVar15;
  FrameBuffer *outfb;
  __base_type _Var16;
  undefined8 *puVar17;
  undefined *puVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  long lVar22;
  long lVar23;
  pointer this_04;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  exr_attr_box2i_t eVar29;
  int32_t scansperchunk;
  TaskGroup tg;
  exr_chunk_info_t cinfo;
  stringstream _iex_throw_s;
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  long local_200;
  int local_1f8;
  undefined4 uStack_1f4;
  int iStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  uint64_t uStack_1e0;
  uint64_t local_1d8;
  uint64_t uStack_1d0;
  uint64_t local_1c8;
  uint64_t uStack_1c0;
  undefined1 local_1b8 [40];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_170;
  
  eVar29 = Context::dataWindow(this->_ctxt,this->partNumber);
  iVar6 = exr_get_scanlines_per_chunk
                    (*(this->_ctxt->_ctxt).
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar6 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Error querying scanline counts from image file \"",
               0x30);
    pcVar10 = Context::fileName(this->_ctxt);
    poVar11 = std::operator<<((ostream *)(local_1b8 + 0x10),pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".",2);
    pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar12,(stringstream *)local_1b8);
    __cxa_throw(pAVar12,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  outfb = (FrameBuffer *)(ulong)(uint)scanLine1;
  if (scanLine2 < scanLine1) {
    outfb = (FrameBuffer *)(ulong)(uint)scanLine2;
  }
  if (scanLine1 < scanLine2) {
    scanLine1 = scanLine2;
  }
  iVar6 = (int)outfb;
  if ((iVar6 < eVar29.min.y) || (eVar29.max.y < scanLine1)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),
               "Tried to read scan line outside the image file\'s data window: ",0x3e);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)(local_1b8 + 0x10),iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," - ",3);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,scanLine1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," vs datawindow ",0xf);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,eVar29.min.y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," - ",3);
    std::ostream::operator<<((ostream *)poVar11,eVar29.max.y);
    pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar12,(stringstream *)local_1b8);
    __cxa_throw(pAVar12,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (0 < ((long)scanLine1 - (long)iVar6) / 1) {
    lVar22 = (long)this->numThreads;
    if (1 < lVar22) {
      IlmThread_3_4::Semaphore::Semaphore((Semaphore *)local_1b8,this->numThreads);
      local_180 = (undefined1  [16])0x0;
      local_190 = (undefined1  [16])0x0;
      local_170._M_b._M_p = (__base_type)(__pointer_type)0x0;
      uVar19 = lVar22 * 0x248;
      pvVar8 = operator_new(uVar19);
      uVar15 = 0;
      do {
        memset((void *)((long)pvVar8 + uVar15),0,0x248);
        *(undefined4 *)((long)pvVar8 + uVar15) = 0x21;
        *(undefined1 *)((long)pvVar8 + uVar15 + 4) = 1;
        uVar15 = uVar15 + 0x248;
      } while (uVar19 != uVar15);
      uVar4 = local_190._8_8_;
      pvVar21 = pvVar8;
      this_04 = (pointer)local_190._0_8_;
      if (local_190._0_8_ != local_190._8_8_) {
        do {
          local_200 = lVar22;
          memcpy(pvVar21,this_04,0x248);
          anon_unknown_6::ScanLineProcess::~ScanLineProcess((ScanLineProcess *)this_04);
          this_04 = this_04 + 1;
          pvVar21 = (void *)((long)pvVar21 + 0x248);
          lVar22 = local_200;
        } while (this_04 != (pointer)uVar4);
      }
      if ((pointer)local_190._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_190._0_8_,local_180._0_8_ - local_190._0_8_);
      }
      auVar3 = _DAT_001b2460;
      local_190._8_8_ = (void *)(uVar19 + (long)pvVar8);
      local_190._0_8_ = pvVar8;
      uVar15 = (ulong)((int)lVar22 - 1);
      lVar23 = lVar22 + -1;
      auVar25._8_4_ = (int)lVar23;
      auVar25._0_8_ = lVar23;
      auVar25._12_4_ = (int)((ulong)lVar23 >> 0x20);
      puVar17 = (undefined8 *)((long)pvVar8 + 0x488);
      uVar20 = 0;
      auVar25 = auVar25 ^ _DAT_001b2460;
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar26 = _DAT_001b3230;
      do {
        auVar28 = auVar26 ^ auVar3;
        lVar23 = auVar26._8_8_;
        if ((bool)(~(auVar28._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar28._0_4_ ||
                    auVar25._4_4_ < auVar28._4_4_) & 1)) {
          pvVar21 = (void *)0x0;
          if (uVar15 != uVar20) {
            pvVar21 = (void *)((auVar26._0_8_ + 1) * 0x248 + (long)pvVar8);
          }
          puVar17[-0x49] = pvVar21;
        }
        if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
            auVar28._12_4_ <= auVar25._12_4_) {
          pvVar21 = (void *)0x0;
          if (uVar15 - 1 != uVar20) {
            pvVar21 = (void *)((lVar23 - auVar27._8_8_) * 0x248 + (long)pvVar8);
          }
          *puVar17 = pvVar21;
        }
        uVar20 = uVar20 + 2;
        auVar26._0_8_ = auVar26._0_8_ + 2;
        auVar26._8_8_ = lVar23 + 2;
        puVar17 = puVar17 + 0x92;
      } while (((int)lVar22 + 1U & 0xfffffffe) != uVar20);
      LOCK();
      local_180._8_8_ = pvVar8;
      local_180._0_8_ = (void *)(uVar19 + (long)pvVar8);
      UNLOCK();
      IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)local_220);
      do {
        iVar6 = exr_read_scanline_chunk_info
                          (*(this->_ctxt->_ctxt).
                            super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,this->partNumber,outfb,&local_1f8);
        if (iVar6 != 0) {
          this_03 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(this_03,"Unable to query scanline information");
          __cxa_throw(this_03,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
        this_01 = (Task *)operator_new(0x38);
        IlmThread_3_4::Task::Task(this_01,(TaskGroup *)local_220);
        *(undefined ***)this_01 = &PTR__LineBufferTask_001e4068;
        *(FrameBuffer **)(this_01 + 0x10) = fb;
        *(Data **)(this_01 + 0x18) = this;
        *(int *)(this_01 + 0x20) = (int)outfb;
        *(int *)(this_01 + 0x24) = scanLine1;
        IlmThread_3_4::Semaphore::wait();
        _Var9._M_p = (__pointer_type)local_180._8_8_;
        do {
          _Var16._M_p = _Var9._M_p;
          if (_Var16._M_p == (__pointer_type)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"GACK: serious failure case???",0x1d);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
            std::ostream::put('\x10');
            std::ostream::flush();
          }
          LOCK();
          bVar24 = _Var16._M_p == (__pointer_type)local_180._8_8_;
          _Var9._M_p = (__pointer_type)local_180._8_8_;
          if (bVar24) {
            local_180._8_8_ = (_Var16._M_p)->next;
            _Var9._M_p = _Var16._M_p;
          }
          UNLOCK();
        } while (!bVar24);
        *(__pointer_type *)(this_01 + 0x28) = _Var16._M_p;
        *(undefined1 **)(this_01 + 0x30) = local_1b8;
        ((_Var16._M_p)->cinfo).sample_count_data_offset = local_1c8;
        ((_Var16._M_p)->cinfo).sample_count_table_size = uStack_1c0;
        ((_Var16._M_p)->cinfo).packed_size = local_1d8;
        ((_Var16._M_p)->cinfo).unpacked_size = uStack_1d0;
        ((_Var16._M_p)->cinfo).width = (undefined4)local_1e8;
        ((_Var16._M_p)->cinfo).level_x = local_1e8._4_1_;
        ((_Var16._M_p)->cinfo).level_y = local_1e8._5_1_;
        ((_Var16._M_p)->cinfo).type = local_1e8._6_1_;
        ((_Var16._M_p)->cinfo).compression = local_1e8._7_1_;
        ((_Var16._M_p)->cinfo).data_offset = uStack_1e0;
        ((_Var16._M_p)->cinfo).idx = local_1f8;
        ((_Var16._M_p)->cinfo).start_x = uStack_1f4;
        ((_Var16._M_p)->cinfo).start_y = iStack_1f0;
        ((_Var16._M_p)->cinfo).height = uStack_1ec;
        IlmThread_3_4::ThreadPool::addGlobalTask(this_01);
        outfb = (FrameBuffer *)(ulong)(iStack_1f0 + 1U);
      } while ((int)(iStack_1f0 + 1U) <= scanLine1);
      IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)local_220);
      aVar5._M_b._M_p = local_170._M_b._M_p;
      LOCK();
      local_170._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      if (aVar5._M_b._M_p == (__pointer_type)0x0) {
        IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true>::
        ~ProcessGroup((ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true> *)
                      local_1b8);
        return;
      }
      local_220[0] = local_210;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_220,*(long *)aVar5._M_b._M_p,
                 *(size_type *)((long)aVar5._M_b._M_p + 8) + *(long *)aVar5._M_b._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(long **)aVar5._M_b._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)aVar5._M_b._M_p + 0x10)) {
        operator_delete(*(long **)aVar5._M_b._M_p,
                        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((long)aVar5._M_b._M_p + 0x10))->_M_allocated_capacity + 1);
      }
      operator_delete((void *)aVar5._M_b._M_p,0x20);
      pIVar13 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar13,(string *)local_220);
      __cxa_throw(pIVar13,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
  }
  __mutex = &this->_mx;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  this_02 = (this->singleScan)._M_t.
            super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
            ._M_t.
            super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
            .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
            _M_head_impl;
  if (this_02 == (ScanLineProcess *)0x0) {
    this_02 = (ScanLineProcess *)operator_new(0x248);
    memset(this_02,0,0x248);
    this_02->last_decode_err = 0x21;
    this_02->first = true;
  }
  else {
    (this->singleScan)._M_t.
    super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
    ._M_t.
    super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
    .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>._M_head_impl =
         (ScanLineProcess *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  peVar1 = &this_02->cinfo;
  do {
    iVar6 = exr_read_scanline_chunk_info
                      (*(this->_ctxt->_ctxt).
                        super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       ,this->partNumber,outfb,&local_1f8);
    if (iVar6 != 0) {
      pIVar13 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc((InputExc *)pIVar13,"Unable to query scanline information");
      pcVar14 = Iex_3_4::InputExc::~InputExc;
      puVar18 = &Iex_3_4::InputExc::typeinfo;
LAB_0019d97f:
      __cxa_throw(pIVar13,puVar18,pcVar14);
    }
    if (((this_02->first == false) && (peVar1->idx == local_1f8)) && (this_02->last_decode_err == 0)
       ) {
      anon_unknown_6::ScanLineProcess::update_pointers(this_02,fb,(int)outfb,scanLine1);
      if (((this_02->decoder).chunk.unpacked_size != 0) &&
         (p_Var2 = (this_02->decoder).unpack_and_convert_fn,
         p_Var2 != (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0)) {
        eVar7 = (*p_Var2)(&this_02->decoder);
        this_02->last_decode_err = eVar7;
        if (eVar7 != 0) {
          pIVar13 = (IoExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::IoExc::IoExc(pIVar13,"Unable to run decoder");
          pcVar14 = Iex_3_4::IoExc::~IoExc;
          puVar18 = &Iex_3_4::IoExc::typeinfo;
          goto LAB_0019d97f;
        }
      }
      anon_unknown_6::ScanLineProcess::run_fill
                (this_02,outfb,
                 (int)(this->fill_list).
                      super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>._M_impl.
                      super__Vector_impl_data._M_start,
                 (vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *)
                 (this->fill_list).
                 super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    else {
      (this_02->cinfo).sample_count_data_offset = local_1c8;
      (this_02->cinfo).sample_count_table_size = uStack_1c0;
      (this_02->cinfo).packed_size = local_1d8;
      (this_02->cinfo).unpacked_size = uStack_1d0;
      (this_02->cinfo).width = (undefined4)local_1e8;
      (this_02->cinfo).level_x = local_1e8._4_1_;
      (this_02->cinfo).level_y = local_1e8._5_1_;
      (this_02->cinfo).type = local_1e8._6_1_;
      (this_02->cinfo).compression = local_1e8._7_1_;
      (this_02->cinfo).data_offset = uStack_1e0;
      peVar1->idx = local_1f8;
      peVar1->start_x = uStack_1f4;
      (this_02->cinfo).start_y = iStack_1f0;
      (this_02->cinfo).height = uStack_1ec;
      anon_unknown_6::ScanLineProcess::run_decode
                (this_02,*(this->_ctxt->_ctxt).
                          super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,this->partNumber,fb,(int)outfb,scanLine1,&this->fill_list);
    }
    outfb = (FrameBuffer *)(ulong)(iStack_1f0 + 1U);
    if (scanLine1 < (int)(iStack_1f0 + 1U)) {
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar6 == 0) {
        this_00 = (this->singleScan)._M_t.
                  super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                  .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
                  _M_head_impl;
        (this->singleScan)._M_t.
        super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
        ._M_t.
        super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
        .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
        _M_head_impl = this_02;
        if (this_00 != (ScanLineProcess *)0x0) {
          anon_unknown_6::ScanLineProcess::~ScanLineProcess(this_00);
          operator_delete(this_00,0x248);
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return;
      }
      std::__throw_system_error(iVar6);
    }
  } while( true );
}

Assistant:

void ScanLineInputFile::Data::readPixels (
    const FrameBuffer &fb, int scanLine1, int scanLine2)
{
    exr_attr_box2i_t dw = _ctxt->dataWindow (partNumber);
    exr_chunk_info_t cinfo;
    int32_t          scansperchunk = 1;

    if (EXR_ERR_SUCCESS != exr_get_scanlines_per_chunk (*_ctxt, partNumber, &scansperchunk))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error querying scanline counts from image "
            "file \"" << _ctxt->fileName () << "\".");
    }

    if (scanLine2 < scanLine1)
        std::swap (scanLine1, scanLine2);

    if (scanLine1 < dw.min.y || scanLine2 > dw.max.y)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Tried to read scan line outside "
            "the image file's data window: "
            << scanLine1 << " - " << scanLine2
            << " vs datawindow "
            << dw.min.y << " - " << dw.max.y);
    }

#if ILMTHREAD_THREADING_ENABLED
    int64_t nchunks;
    nchunks = ((int64_t) scanLine2 - (int64_t) scanLine1);
    nchunks /= (int64_t) scansperchunk;
    nchunks += 1;

    if (nchunks > 1 && numThreads > 1)
    {
        // we need the lifetime of this to last longer than the
        // lifetime of the task group below such that we don't get use
        // after free type error, so use scope rules to accomplish
        // this
        ScanLineProcessGroup sg (numThreads);

        {
            ILMTHREAD_NAMESPACE::TaskGroup tg;

            for (int y = scanLine1; y <= scanLine2; )
            {
                if (EXR_ERR_SUCCESS != exr_read_scanline_chunk_info (*_ctxt, partNumber, y, &cinfo))
                    throw IEX_NAMESPACE::InputExc ("Unable to query scanline information");

                ILMTHREAD_NAMESPACE::ThreadPool::addGlobalTask (
                    new LineBufferTask (&tg, this, &sg, &fb, cinfo, y, scanLine2) );

                y += scansperchunk - (y - cinfo.start_y);
            }
        }

        sg.throw_on_failure ();
    }
    else
#endif
    {
        std::unique_ptr<ScanLineProcess> sp = checkoutScan ();

        for (int y = scanLine1; y <= scanLine2; )
        {
            if (EXR_ERR_SUCCESS != exr_read_scanline_chunk_info (*_ctxt, partNumber, y, &cinfo))
                throw IEX_NAMESPACE::InputExc ("Unable to query scanline information");

            // check if we have the same chunk where we can just
            // re-run the unpack (i.e. people reading 1 scan at a time
            // in a multi-scanline chunk)
            if (!sp->first && sp->cinfo.idx == cinfo.idx &&
                sp->last_decode_err == EXR_ERR_SUCCESS)
            {
                sp->run_unpack (
                    *_ctxt,
                    partNumber,
                    &fb,
                    y,
                    scanLine2,
                    fill_list);
            }
            else
            {
                sp->cinfo = cinfo;
                sp->run_decode (
                    *_ctxt,
                    partNumber,
                    &fb,
                    y,
                    scanLine2,
                    fill_list);
            }

            y += scansperchunk - (y - cinfo.start_y);
        }

        checkinScan (sp);
    }
}